

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall
sector_t::NextHighestCeilingAt
          (sector_t *this,double x,double y,double bottomz,double topz,int flags,
          sector_t **resultsec,F3DFloor **resultffloor)

{
  F3DFloor *pFVar1;
  bool bVar2;
  F3DFloor **ppFVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 local_a8 [8];
  DVector2 pos;
  double delta2;
  double delta1;
  double ff_top;
  double ff_bottom;
  F3DFloor *rover;
  int i;
  double realceil;
  double planeheight;
  sector_t *sec;
  F3DFloor **resultffloor_local;
  sector_t **resultsec_local;
  int flags_local;
  double topz_local;
  double bottomz_local;
  double y_local;
  double x_local;
  sector_t *this_local;
  
  realceil = -3.4028234663852886e+38;
  planeheight = (double)this;
  bottomz_local = y;
  y_local = x;
  do {
    dVar4 = secplane_t::ZatPoint((secplane_t *)((long)planeheight + 0xd8),y_local,bottomz_local);
    rover._4_4_ = TArray<F3DFloor_*,_F3DFloor_*>::Size
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)
                             (*(long *)((long)planeheight + 0x200) + 0x70));
    while (rover._4_4_ = rover._4_4_ - 1, -1 < (int)rover._4_4_) {
      ppFVar3 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)
                           (*(long *)((long)planeheight + 0x200) + 0x70),(long)(int)rover._4_4_);
      pFVar1 = *ppFVar3;
      if (((pFVar1->flags & 2) != 0) && ((pFVar1->flags & 1) != 0)) {
        dVar5 = secplane_t::ZatPoint((pFVar1->bottom).plane,y_local,bottomz_local);
        dVar6 = secplane_t::ZatPoint((pFVar1->top).plane,y_local,bottomz_local);
        pos.Y = topz - (dVar5 + (dVar6 - dVar5) / 2.0);
        if ((dVar5 < dVar4) && (ABS(pos.Y) < ABS(bottomz - (dVar5 + (dVar6 - dVar5) / 2.0)))) {
          if (resultsec != (sector_t **)0x0) {
            *resultsec = (sector_t *)planeheight;
          }
          if (resultffloor == (F3DFloor **)0x0) {
            return dVar5;
          }
          *resultffloor = pFVar1;
          return dVar5;
        }
      }
    }
    if ((((flags & 0x10U) != 0) || (bVar2 = PortalBlocksMovement((sector_t *)planeheight,1), bVar2))
       || (dVar5 = GetPortalPlaneZ((sector_t *)planeheight,1), dVar5 <= realceil)) {
      if (resultffloor != (F3DFloor **)0x0) {
        *resultffloor = (F3DFloor *)0x0;
      }
      if (resultsec != (sector_t **)0x0) {
        *resultsec = (sector_t *)planeheight;
      }
      return dVar4;
    }
    GetPortalDisplacement((sector_t *)local_a8,SUB84(planeheight,0));
    y_local = (double)local_a8 + y_local;
    bottomz_local = pos.X + bottomz_local;
    realceil = GetPortalPlaneZ((sector_t *)planeheight,1);
    planeheight = (double)P_PointInSector(y_local,bottomz_local);
  } while( true );
}

Assistant:

double sector_t::NextHighestCeilingAt(double x, double y, double bottomz, double topz, int flags, sector_t **resultsec, F3DFloor **resultffloor)
{
	sector_t *sec = this;
	double planeheight = -FLT_MAX;

	while (true)
	{
		// Looking through planes from bottom to top
		double realceil = sec->ceilingplane.ZatPoint(x, y);
		for (int i = sec->e->XFloor.ffloors.Size() - 1; i >= 0; --i)
		{
			F3DFloor *rover = sec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(x, y);
			double ff_top = rover->top.plane->ZatPoint(x, y);

			double delta1 = bottomz - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = topz - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_bottom < realceil && fabs(delta1) > fabs(delta2))
			{ 
				if (resultsec) *resultsec = sec;
				if (resultffloor) *resultffloor = rover;
				return ff_bottom;
			}
		}
		if ((flags & FFCF_NOPORTALS) || sec->PortalBlocksMovement(ceiling) || planeheight >= sec->GetPortalPlaneZ(ceiling))
		{ // Use sector's floor
			if (resultffloor) *resultffloor = NULL;
			if (resultsec) *resultsec = sec;
			return realceil;
		}
		else
		{
			DVector2 pos = sec->GetPortalDisplacement(ceiling);
			x += pos.X;
			y += pos.Y;
			planeheight = sec->GetPortalPlaneZ(ceiling);
			sec = P_PointInSector(x, y);
		}
	}
}